

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O2

void __thiscall webrtc::EchoCancellationImpl::AllocateRenderQueue(EchoCancellationImpl *this)

{
  size_t sVar1;
  SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>
  *this_00;
  ulong __n;
  CritScope cs_capture;
  CritScope cs_render;
  RenderQueueItemVerifier<float> local_30;
  vector<float,_std::allocator<float>_> template_queue_element;
  
  sVar1 = NumCancellersRequired(this);
  __n = sVar1 * 0xa0 + (ulong)(sVar1 * 0xa0 == 0);
  rtc::CritScope::CritScope(&cs_render,this->crit_render_);
  rtc::CritScope::CritScope(&cs_capture,this->crit_capture_);
  if (this->render_queue_element_max_size_ < __n) {
    this->render_queue_element_max_size_ = __n;
    std::vector<float,_std::allocator<float>_>::vector
              (&template_queue_element,__n,(allocator_type *)&local_30);
    this_00 = (SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>
               *)operator_new(0x70);
    local_30.minimum_capacity_ = this->render_queue_element_max_size_;
    SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>::
    SwapQueue(this_00,100,&template_queue_element,&local_30);
    std::
    __uniq_ptr_impl<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
    ::reset((__uniq_ptr_impl<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
             *)&this->render_signal_queue_,this_00);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->render_queue_buffer_,this->render_queue_element_max_size_);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->capture_queue_buffer_,this->render_queue_element_max_size_);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&template_queue_element.super__Vector_base<float,_std::allocator<float>_>);
  }
  else {
    SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>::
    Clear((this->render_signal_queue_)._M_t.
          super___uniq_ptr_impl<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_*,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
          .
          super__Head_base<0UL,_webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_*,_false>
          ._M_head_impl);
  }
  rtc::CritScope::~CritScope(&cs_capture);
  rtc::CritScope::~CritScope(&cs_render);
  return;
}

Assistant:

void EchoCancellationImpl::AllocateRenderQueue() {
  const size_t new_render_queue_element_max_size = std::max<size_t>(
      static_cast<size_t>(1),
      kMaxAllowedValuesOfSamplesPerFrame * NumCancellersRequired());

  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  // Reallocate the queue if the queue item size is too small to fit the
  // data to put in the queue.
  if (render_queue_element_max_size_ < new_render_queue_element_max_size) {
    render_queue_element_max_size_ = new_render_queue_element_max_size;

    std::vector<float> template_queue_element(render_queue_element_max_size_);

    render_signal_queue_.reset(
        new SwapQueue<std::vector<float>, RenderQueueItemVerifier<float>>(
            kMaxNumFramesToBuffer, template_queue_element,
            RenderQueueItemVerifier<float>(render_queue_element_max_size_)));

    render_queue_buffer_.resize(render_queue_element_max_size_);
    capture_queue_buffer_.resize(render_queue_element_max_size_);
  } else {
    render_signal_queue_->Clear();
  }
}